

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv__pipe_getsockpeername(uv_pipe_t *handle,uv__peersockfunc func,char *buffer,size_t *size)

{
  int iVar1;
  uint uVar2;
  ulong __n;
  sockaddr_un sa;
  int local_9c;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  undefined8 uStack_32;
  size_t sVar3;
  
  local_9c = 0x6e;
  local_98.sa_family = 0;
  local_98.sa_data[0] = '\0';
  local_98.sa_data[1] = '\0';
  local_98.sa_data[2] = '\0';
  local_98.sa_data[3] = '\0';
  local_98.sa_data[4] = '\0';
  local_98.sa_data[5] = '\0';
  local_98.sa_data[6] = '\0';
  local_98.sa_data[7] = '\0';
  local_98.sa_data[8] = '\0';
  local_98.sa_data[9] = '\0';
  local_98.sa_data[10] = '\0';
  local_98.sa_data[0xb] = '\0';
  local_98.sa_data[0xc] = '\0';
  local_98.sa_data[0xd] = '\0';
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_3a = 0;
  uStack_38 = 0;
  uStack_32 = 0;
  iVar1 = uv__getsockpeername((uv_handle_t *)handle,func,&local_98,&local_9c);
  if (iVar1 < 0) {
    *size = 0;
  }
  else {
    if (local_98.sa_data[0] == '\0') {
      uVar2 = local_9c - 2;
    }
    else {
      sVar3 = strlen(local_98.sa_data);
      uVar2 = (uint)sVar3;
    }
    __n = (ulong)uVar2;
    if (__n < *size) {
      memcpy(buffer,local_98.sa_data,__n);
      *size = __n;
      iVar1 = 0;
      if (*buffer != '\0') {
        buffer[__n] = '\0';
      }
    }
    else {
      *size = (ulong)(uVar2 + 1);
      iVar1 = -0x69;
    }
  }
  return iVar1;
}

Assistant:

static int uv__pipe_getsockpeername(const uv_pipe_t* handle,
                                    uv__peersockfunc func,
                                    char* buffer,
                                    size_t* size) {
  struct sockaddr_un sa;
  socklen_t addrlen;
  int err;

  addrlen = sizeof(sa);
  memset(&sa, 0, addrlen);
  err = uv__getsockpeername((const uv_handle_t*) handle,
                            func,
                            (struct sockaddr*) &sa,
                            (int*) &addrlen);
  if (err < 0) {
    *size = 0;
    return err;
  }

#if defined(__linux__)
  if (sa.sun_path[0] == 0)
    /* Linux abstract namespace */
    addrlen -= offsetof(struct sockaddr_un, sun_path);
  else
#endif
    addrlen = strlen(sa.sun_path);


  if (addrlen >= *size) {
    *size = addrlen + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, sa.sun_path, addrlen);
  *size = addrlen;

  /* only null-terminate if it's not an abstract socket */
  if (buffer[0] != '\0')
    buffer[addrlen] = '\0';

  return 0;
}